

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

bool tinyformat::detail::parseWidthOrPrecision
               (int *n,char **c,bool positionalMode,FormatArg *args,int *argIndex,int numArgs)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  runtime_error *this;
  
  cVar1 = **c;
  if ((byte)(cVar1 - 0x30U) < 10) {
    iVar2 = parseIntAndAdvance(c);
LAB_0010f07d:
    *n = iVar2;
    return true;
  }
  if (cVar1 != '*') {
    return false;
  }
  *c = *c + 1;
  *n = 0;
  if (positionalMode) {
    uVar3 = parseIntAndAdvance(c);
    if (**c == '$') {
      if ((0 < (int)uVar3) && ((int)uVar3 <= numArgs)) {
        iVar2 = (*args[(ulong)uVar3 - 1].m_toIntImpl)(args[(ulong)uVar3 - 1].m_value);
        *n = iVar2;
        *c = *c + 1;
        return true;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"tinyformat: Positional argument out of range");
    }
    else {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"tinyformat: Non-positional argument used after a positional one");
    }
  }
  else {
    iVar2 = *argIndex;
    if (iVar2 < numArgs) {
      *argIndex = iVar2 + 1;
      iVar2 = (*args[iVar2].m_toIntImpl)(args[iVar2].m_value);
      goto LAB_0010f07d;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"tinyformat: Not enough arguments to read variable width or precision");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline bool parseWidthOrPrecision(int& n, const char*& c, bool positionalMode,
                                  const detail::FormatArg* args,
                                  int& argIndex, int numArgs)
{
    if (*c >= '0' && *c <= '9') {
        n = parseIntAndAdvance(c);
    }
    else if (*c == '*') {
        ++c;
        n = 0;
        if (positionalMode) {
            int pos = parseIntAndAdvance(c) - 1;
            if (*c != '$')
                TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
            if (pos >= 0 && pos < numArgs)
                n = args[pos].toInt();
            else
                TINYFORMAT_ERROR("tinyformat: Positional argument out of range");
            ++c;
        }
        else {
            if (argIndex < numArgs)
                n = args[argIndex++].toInt();
            else
                TINYFORMAT_ERROR("tinyformat: Not enough arguments to read variable width or precision");
        }
    }
    else {
        return false;
    }
    return true;
}